

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedNumberFormat::parse
          (RuleBasedNumberFormat *this,UnicodeString *text,Formattable *result,
          ParsePosition *parsePosition)

{
  double number;
  int iVar1;
  bool bVar2;
  bool bVar3;
  Formattable *this_00;
  UBool UVar4;
  undefined4 uVar5;
  Type TVar6;
  int iVar7;
  NFRuleSet *this_01;
  NFRuleSet **ppNVar8;
  double dVar9;
  ParsePosition high_pp;
  ParsePosition working_pp;
  ParsePosition workingPos;
  UnicodeString workingText;
  Formattable high_result;
  Formattable working_result;
  ParsePosition local_188;
  ParsePosition local_178;
  Formattable *local_168;
  ParsePosition local_160;
  UnicodeString local_150;
  Formattable local_110;
  Formattable local_a0;
  
  if (this->fRuleSets == (NFRuleSet **)0x0) {
    parsePosition->errorIndex = 0;
  }
  else {
    local_168 = result;
    UnicodeString::UnicodeString(&local_150,text,parsePosition->index);
    local_160.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003dc090;
    local_160.index = 0;
    local_160.errorIndex = -1;
    local_188.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003dc090;
    local_188.index = 0;
    local_188.errorIndex = -1;
    Formattable::Formattable(&local_110);
    ppNVar8 = this->fRuleSets;
    this_01 = *ppNVar8;
    if (this_01 != (NFRuleSet *)0x0) {
      do {
        ppNVar8 = ppNVar8 + 1;
        if ((this_01->fIsPublic == '\0') || (this_01->fIsParseable == '\0')) {
LAB_0021e6b2:
          bVar3 = false;
        }
        else {
          local_178.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003dc090;
          local_178.index = 0;
          local_178.errorIndex = -1;
          Formattable::Formattable(&local_a0);
          NFRuleSet::parse(this_01,&local_150,&local_178,17592186044416.0,0,&local_a0);
          if (local_188.index < local_178.index) {
            local_188.index = local_178.index;
            local_188.errorIndex = local_178.errorIndex;
            Formattable::operator=(&local_110,&local_a0);
            uVar5 = local_150.fUnion.fFields.fLength;
            if (-1 < local_150.fUnion.fStackFields.fLengthAndFlags) {
              uVar5 = (int)local_150.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            if (local_188.index != uVar5) goto LAB_0021e698;
            bVar3 = true;
            bVar2 = false;
          }
          else {
LAB_0021e698:
            bVar3 = false;
            bVar2 = true;
          }
          Formattable::~Formattable(&local_a0);
          ParsePosition::~ParsePosition(&local_178);
          if (bVar2) goto LAB_0021e6b2;
        }
      } while ((!bVar3) && (this_01 = *ppNVar8, this_01 != (NFRuleSet *)0x0));
    }
    this_00 = local_168;
    iVar1 = parsePosition->index;
    parsePosition->index = local_188.index + iVar1;
    iVar7 = -1;
    if (local_188.index < 1) {
      iVar7 = 0;
      if (0 < local_188.errorIndex) {
        iVar7 = local_188.errorIndex;
      }
      iVar7 = iVar7 + iVar1;
    }
    parsePosition->errorIndex = iVar7;
    Formattable::operator=(local_168,&local_110);
    TVar6 = Formattable::getType(this_00);
    if (TVar6 == kDouble) {
      number = (this_00->fValue).fDouble;
      UVar4 = uprv_isNaN_63(number);
      if (((UVar4 == '\0') && (dVar9 = uprv_trunc_63(number), number <= 2147483647.0)) &&
         (-2147483648.0 <= number)) {
        if ((number == dVar9) && (!NAN(number) && !NAN(dVar9))) {
          Formattable::setLong(this_00,(int)number);
        }
      }
    }
    Formattable::~Formattable(&local_110);
    ParsePosition::~ParsePosition(&local_188);
    ParsePosition::~ParsePosition(&local_160);
    UnicodeString::~UnicodeString(&local_150);
  }
  return;
}

Assistant:

void
RuleBasedNumberFormat::parse(const UnicodeString& text,
                             Formattable& result,
                             ParsePosition& parsePosition) const
{
    if (!fRuleSets) {
        parsePosition.setErrorIndex(0);
        return;
    }

    UnicodeString workingText(text, parsePosition.getIndex());
    ParsePosition workingPos(0);

    ParsePosition high_pp(0);
    Formattable high_result;

    for (NFRuleSet** p = fRuleSets; *p; ++p) {
        NFRuleSet *rp = *p;
        if (rp->isPublic() && rp->isParseable()) {
            ParsePosition working_pp(0);
            Formattable working_result;

            rp->parse(workingText, working_pp, kMaxDouble, 0, working_result);
            if (working_pp.getIndex() > high_pp.getIndex()) {
                high_pp = working_pp;
                high_result = working_result;

                if (high_pp.getIndex() == workingText.length()) {
                    break;
                }
            }
        }
    }

    int32_t startIndex = parsePosition.getIndex();
    parsePosition.setIndex(startIndex + high_pp.getIndex());
    if (high_pp.getIndex() > 0) {
        parsePosition.setErrorIndex(-1);
    } else {
        int32_t errorIndex = (high_pp.getErrorIndex()>0)? high_pp.getErrorIndex(): 0;
        parsePosition.setErrorIndex(startIndex + errorIndex);
    }
    result = high_result;
    if (result.getType() == Formattable::kDouble) {
        double d = result.getDouble();
        if (!uprv_isNaN(d) && d == uprv_trunc(d) && INT32_MIN <= d && d <= INT32_MAX) {
            // Note: casting a double to an int when the double is too large or small
            //       to fit the destination is undefined behavior. The explicit range checks,
            //       above, are required. Just casting and checking the result value is undefined.
            result.setLong(static_cast<int32_t>(d));
        }
    }
}